

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::ScaleParameter::InternalSerializeWithCachedSizesToArray
          (ScaleParameter *this,bool deterministic,uint8 *target)

{
  FillerParameter *pFVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  uint8 *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 8) != 0) {
    uVar9 = (ulong)this->axis_;
    pbVar6 = target + 1;
    *target = '\b';
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar3 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar3);
    }
    *pbVar6 = (byte)uVar10;
    target = pbVar6 + 1;
  }
  if ((uVar8 & 0x10) != 0) {
    uVar9 = (ulong)this->num_axes_;
    pbVar6 = target + 1;
    *target = 0x10;
    uVar10 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar3 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar3);
    }
    *pbVar6 = (byte)uVar10;
    target = pbVar6 + 1;
  }
  if ((uVar8 & 1) != 0) {
    pFVar1 = this->filler_;
    *target = 0x1a;
    pbVar6 = target + 1;
    uVar5 = pFVar1->_cached_size_;
    uVar4 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar6 = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar3);
    }
    *pbVar6 = (byte)uVar4;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar1,false,pbVar6 + 1);
  }
  if ((uVar8 & 4) != 0) {
    bVar3 = this->bias_term_;
    *target = 0x20;
    target[1] = bVar3;
    target = target + 2;
  }
  if ((uVar8 & 2) != 0) {
    pFVar1 = this->bias_filler_;
    *target = 0x2a;
    pbVar6 = target + 1;
    uVar8 = pFVar1->_cached_size_;
    uVar5 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar3);
    }
    *pbVar6 = (byte)uVar5;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar1,false,pbVar6 + 1);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar7 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar7;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ScaleParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ScaleParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 axis = 1 [default = 1];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->axis(), target);
  }

  // optional int32 num_axes = 2 [default = 1];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->num_axes(), target);
  }

  // optional .caffe.FillerParameter filler = 3;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->filler_, deterministic, target);
  }

  // optional bool bias_term = 4 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(4, this->bias_term(), target);
  }

  // optional .caffe.FillerParameter bias_filler = 5;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, *this->bias_filler_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ScaleParameter)
  return target;
}